

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::transcode_uastc_to_etc2_eac_a8
               (unpacked_uastc_block *unpacked_src_blk,color32 (*block_pixels) [4],void *pDst)

{
  byte bVar1;
  ushort uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  byte *pbVar9;
  eac_block *in_RDX;
  ulong uVar10;
  long in_RSI;
  long in_RDI;
  float fVar11;
  uint64_t best_index;
  uint32_t min_err;
  uint32_t err7;
  uint32_t err6;
  uint32_t err5;
  uint32_t err4;
  uint32_t err3;
  uint32_t err2;
  uint32_t err1;
  uint32_t err0;
  uint32_t a_1;
  uint32_t i_1;
  uint64_t sels;
  uint32_t j;
  uint32_t vals [8];
  int8_t *pTable;
  int center;
  float range;
  int multiplier;
  uint32_t table;
  uint32_t i;
  uint32_t max_a;
  uint32_t min_a;
  uint32_t a;
  color32 *pSrc_pixels;
  eac_block *dst;
  uint32_t in_stack_ffffffffffffff3c;
  color32 *in_stack_ffffffffffffff40;
  uint local_8c;
  ulong local_88;
  uint local_7c;
  uint local_78 [4];
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  undefined1 *local_50;
  int local_48;
  float local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  long local_28;
  eac_block *local_20;
  long local_10;
  long local_8;
  
  local_20 = in_RDX;
  if ((g_uastc_mode_has_alpha[*(uint *)(in_RDI + 0x68)] == '\0') || (*(int *)(in_RDI + 0x68) == 8))
  {
    if (*(int *)(in_RDI + 0x68) == 8) {
      pbVar9 = color32::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      uVar2 = (ushort)*pbVar9;
    }
    else {
      uVar2 = 0xff;
    }
    *(ushort *)local_20 = *(ushort *)local_20 & 0xff00 | uVar2;
    *(ushort *)local_20 = *(ushort *)local_20 & 0xf0ff | 0xd00;
    *(ushort *)local_20 = *(ushort *)local_20 & 0xfff | 0x1000;
    local_20->m_selectors[0] = 0x92;
    local_20->m_selectors[1] = 'I';
    local_20->m_selectors[2] = '$';
    local_20->m_selectors[3] = 0x92;
    local_20->m_selectors[4] = 'I';
    local_20->m_selectors[5] = '$';
  }
  else {
    local_30 = 0xff;
    local_34 = 0;
    local_28 = in_RSI;
    local_10 = in_RSI;
    local_8 = in_RDI;
    for (local_38 = 0; local_38 < 0x10; local_38 = local_38 + 1) {
      local_30 = basisu::minimum<unsigned_int>
                           (local_30,(uint)*(byte *)(local_28 + 3 + (ulong)local_38 * 4));
      local_34 = basisu::maximum<unsigned_int>
                           (local_34,(uint)*(byte *)(local_28 + 3 + (ulong)local_38 * 4));
    }
    if (local_30 == local_34) {
      *(ushort *)local_20 = *(ushort *)local_20 & 0xff00 | (ushort)local_30 & 0xff;
      *(ushort *)local_20 = *(ushort *)local_20 & 0xf0ff | 0xd00;
      *(ushort *)local_20 = *(ushort *)local_20 & 0xfff | 0x1000;
      local_20->m_selectors[0] = 0x92;
      local_20->m_selectors[1] = 'I';
      local_20->m_selectors[2] = '$';
      local_20->m_selectors[3] = 0x92;
      local_20->m_selectors[4] = 'I';
      local_20->m_selectors[5] = '$';
    }
    else {
      local_3c = *(uint *)(local_8 + 0x84) & 0xf;
      local_40 = *(uint *)(local_8 + 0x84) >> 4;
      if (local_40 == 0) {
        __assert_fail("multiplier >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x38ba,
                      "void basist::transcode_uastc_to_etc2_eac_a8(unpacked_uastc_block &, color32 (*)[4], void *)"
                     );
      }
      *(ushort *)local_20 = *(ushort *)local_20 & 0xfff | (ushort)(local_40 << 0xc);
      *(ushort *)local_20 = *(ushort *)local_20 & 0xf0ff | (ushort)(local_3c << 8);
      uVar10 = (ulong)((byte)local_20->field_0x1 & 0xf);
      local_44 = (float)((int)(char)g_eac_modifier_table[uVar10 * 8 + 7] -
                        (int)(char)g_eac_modifier_table[uVar10 * 8 + 3]);
      fVar11 = basisu::lerp<float,float>
                         ((float)local_30,(float)local_34,
                          (float)-(int)(char)g_eac_modifier_table
                                             [(ulong)(*(ushort *)local_20 >> 8 & 0xf) * 8 + 3] /
                          local_44);
      fVar11 = roundf(fVar11);
      local_48 = (int)fVar11;
      *(ushort *)local_20 = *(ushort *)local_20 & 0xff00 | (ushort)local_48 & 0xff;
      local_50 = g_eac_modifier_table + (ulong)(*(ushort *)local_20 >> 8 & 0xf) * 8;
      for (local_7c = 0; local_7c < 8; local_7c = local_7c + 1) {
        bVar1 = clamp255(local_48 + (int)(char)local_50[local_7c] * local_40);
        local_78[local_7c] = (uint)bVar1;
      }
      local_88 = 0;
      for (local_8c = 0; local_8c < 0x10; local_8c = local_8c + 1) {
        uVar8 = (uint)*(byte *)(local_10 + (ulong)(local_8c & 3) * 0x10 + 3 +
                               (ulong)(local_8c >> 2) * 4);
        basisu::iabs(local_78[0] - uVar8);
        basisu::iabs(local_78[1] - uVar8);
        basisu::iabs(local_78[2] - uVar8);
        uVar3 = basisu::iabs(local_78[3] - uVar8);
        uVar4 = basisu::iabs(local_68 - uVar8);
        uVar5 = basisu::iabs(local_64 - uVar8);
        uVar6 = basisu::iabs(local_60 - uVar8);
        uVar7 = basisu::iabs(local_5c - uVar8);
        uVar8 = basisu::minimum<unsigned_int>
                          ((uint)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                           (uint)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        uVar8 = basisu::minimum<unsigned_int>(uVar8,uVar3 << 3 | 3);
        uVar8 = basisu::minimum<unsigned_int>(uVar8,uVar4 << 3 | 4);
        uVar8 = basisu::minimum<unsigned_int>(uVar8,uVar5 << 3 | 5);
        uVar8 = basisu::minimum<unsigned_int>(uVar8,uVar6 << 3 | 6);
        uVar8 = basisu::minimum<unsigned_int>(uVar8,uVar7 << 3 | 7);
        in_stack_ffffffffffffff40 = (color32 *)(ulong)(uVar8 & 7);
        local_88 = (long)in_stack_ffffffffffffff40 << ((char)local_8c * -3 + 0x2dU & 0x3f) |
                   local_88;
      }
      eac_block::set_selector_bits(local_20,local_88);
    }
  }
  return;
}

Assistant:

void transcode_uastc_to_etc2_eac_a8(unpacked_uastc_block& unpacked_src_blk, color32 block_pixels[4][4], void* pDst)
	{
		eac_block& dst = *static_cast<eac_block*>(pDst);
		const color32* pSrc_pixels = &block_pixels[0][0];

		if ((!g_uastc_mode_has_alpha[unpacked_src_blk.m_mode]) || (unpacked_src_blk.m_mode == UASTC_MODE_INDEX_SOLID_COLOR))
		{
			const uint32_t a = (unpacked_src_blk.m_mode == UASTC_MODE_INDEX_SOLID_COLOR) ? unpacked_src_blk.m_solid_color[3] : 255;

			dst.m_base = a;
			dst.m_table = 13;
			dst.m_multiplier = 1;

			memcpy(dst.m_selectors, g_etc2_eac_a8_sel4, sizeof(g_etc2_eac_a8_sel4));

			return;
		}

		uint32_t min_a = 255, max_a = 0;
		for (uint32_t i = 0; i < 16; i++)
		{
			min_a = basisu::minimum<uint32_t>(min_a, pSrc_pixels[i].a);
			max_a = basisu::maximum<uint32_t>(max_a, pSrc_pixels[i].a);
		}

		if (min_a == max_a)
		{
			dst.m_base = min_a;
			dst.m_table = 13;
			dst.m_multiplier = 1;

			memcpy(dst.m_selectors, g_etc2_eac_a8_sel4, sizeof(g_etc2_eac_a8_sel4));
			return;
		}

		const uint32_t table = unpacked_src_blk.m_etc2_hints & 0xF;
		const int multiplier = unpacked_src_blk.m_etc2_hints >> 4;

		assert(multiplier >= 1);

		dst.m_multiplier = multiplier;
		dst.m_table = table;

		const float range = (float)(g_eac_modifier_table[dst.m_table][ETC2_EAC_MAX_VALUE_SELECTOR] - g_eac_modifier_table[dst.m_table][ETC2_EAC_MIN_VALUE_SELECTOR]);
		const int center = (int)roundf(basisu::lerp((float)min_a, (float)max_a, (float)(0 - g_eac_modifier_table[dst.m_table][ETC2_EAC_MIN_VALUE_SELECTOR]) / range));

		dst.m_base = center;

		const int8_t* pTable = &g_eac_modifier_table[dst.m_table][0];

		uint32_t vals[8];
		for (uint32_t j = 0; j < 8; j++)
			vals[j] = clamp255(center + (pTable[j] * multiplier));

		uint64_t sels = 0;
		for (uint32_t i = 0; i < 16; i++)
		{
			const uint32_t a = block_pixels[i & 3][i >> 2].a;

			const uint32_t err0 = (basisu::iabs(vals[0] - a) << 3) | 0;
			const uint32_t err1 = (basisu::iabs(vals[1] - a) << 3) | 1;
			const uint32_t err2 = (basisu::iabs(vals[2] - a) << 3) | 2;
			const uint32_t err3 = (basisu::iabs(vals[3] - a) << 3) | 3;
			const uint32_t err4 = (basisu::iabs(vals[4] - a) << 3) | 4;
			const uint32_t err5 = (basisu::iabs(vals[5] - a) << 3) | 5;
			const uint32_t err6 = (basisu::iabs(vals[6] - a) << 3) | 6;
			const uint32_t err7 = (basisu::iabs(vals[7] - a) << 3) | 7;

			const uint32_t min_err = basisu::minimum(basisu::minimum(basisu::minimum(basisu::minimum(basisu::minimum(basisu::minimum(err0, err1, err2), err3), err4), err5), err6), err7);

			const uint64_t best_index = min_err & 7;
			sels |= (best_index << (45 - i * 3));
		}

		dst.set_selector_bits(sels);
	}